

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_builder.h
# Opt level: O2

Instruction * __thiscall
spvtools::opt::InstructionBuilder::AddConditionalBranch
          (InstructionBuilder *this,uint32_t cond_id,uint32_t true_id,uint32_t false_id,
          uint32_t merge_id,uint32_t selection_control)

{
  IRContext *c;
  tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_> this_00;
  Instruction *pIVar1;
  long lVar2;
  undefined4 uVar3;
  initializer_list<unsigned_int> init_list;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<unsigned_int> init_list_01;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  local_168;
  uint32_t local_15c;
  uint32_t local_158;
  uint32_t local_154;
  SmallVector<unsigned_int,_2UL> local_150;
  SmallVector<unsigned_int,_2UL> local_128;
  SmallVector<unsigned_int,_2UL> local_100;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined1 local_c0 [48];
  undefined4 local_90;
  SmallVector<unsigned_int,_2UL> local_88;
  undefined4 local_60;
  SmallVector<unsigned_int,_2UL> local_58;
  
  if (merge_id != 0xffffffff) {
    AddSelectionMerge(this,merge_id,selection_control);
  }
  this_00.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
        )operator_new(0x70);
  c = this->context_;
  init_list._M_len = 1;
  init_list._M_array = &local_154;
  local_154 = cond_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_100,init_list);
  uVar3 = 1;
  local_c0._0_4_ = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector
            ((SmallVector<unsigned_int,_2UL> *)(local_c0 + 8),&local_100);
  init_list_00._M_len = 1;
  init_list_00._M_array = &local_158;
  local_158 = true_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_128,init_list_00);
  local_90 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_88,&local_128);
  init_list_01._M_len = 1;
  init_list_01._M_array = &local_15c;
  local_15c = false_id;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_150,init_list_01);
  local_60 = uVar3;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_58,&local_150);
  local_d8 = 0;
  uStack_d0 = 0;
  local_c8 = 0;
  std::vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>>::
  _M_range_initialize<spvtools::opt::Operand_const*>
            ((vector<spvtools::opt::Operand,std::allocator<spvtools::opt::Operand>> *)&local_d8,
             local_c0,&stack0xffffffffffffffd0);
  Instruction::Instruction
            ((Instruction *)
             this_00.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,c,
             OpBranchConditional,0,0,(OperandList *)&local_d8);
  local_168._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
  .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       (tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>)
       this_00.
       super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
  std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
            ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&local_d8);
  lVar2 = 0x68;
  do {
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector
              ((SmallVector<unsigned_int,_2UL> *)(local_c0 + lVar2));
    lVar2 = lVar2 + -0x30;
  } while (lVar2 != -0x28);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_150);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_128);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_100);
  pIVar1 = AddInstruction(this,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                                *)&local_168);
  if (local_168._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
      (_Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
       )0x0) {
    (**(code **)(*(long *)local_168._M_t.
                          super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                          .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl +
                8))();
  }
  return pIVar1;
}

Assistant:

Instruction* AddConditionalBranch(
      uint32_t cond_id, uint32_t true_id, uint32_t false_id,
      uint32_t merge_id = kInvalidId,
      uint32_t selection_control =
          static_cast<uint32_t>(spv::SelectionControlMask::MaskNone)) {
    if (merge_id != kInvalidId) {
      AddSelectionMerge(merge_id, selection_control);
    }
    std::unique_ptr<Instruction> new_branch(new Instruction(
        GetContext(), spv::Op::OpBranchConditional, 0, 0,
        {{spv_operand_type_t::SPV_OPERAND_TYPE_ID, {cond_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {true_id}},
         {spv_operand_type_t::SPV_OPERAND_TYPE_ID, {false_id}}}));
    return AddInstruction(std::move(new_branch));
  }